

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

vector<float,_pstd::pmr::polymorphic_allocator<float>_> *
pbrt::Sample1DFunction
          (function<float_(float)> *f,int nSteps,int nSamples,Float min,Float max,Allocator alloc)

{
  double *pdVar1;
  int in_ECX;
  int in_EDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  int __x;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  Float in_XMM0_Da;
  float fVar2;
  Float in_XMM1_Da;
  Float fv;
  Float v;
  Float delta;
  int j;
  double accum;
  int i;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *values;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  function<float_(float)> *in_stack_ffffffffffffff50;
  polymorphic_allocator<float> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  double local_70;
  float local_68;
  Float local_54;
  float local_50;
  int local_4c;
  double local_48;
  int local_3c;
  undefined4 local_30;
  undefined1 local_29;
  Float local_28;
  Float local_24;
  int local_20;
  int local_1c;
  
  local_29 = 0;
  local_30 = 0;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  local_20 = in_ECX;
  local_1c = in_EDX;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)in_stack_ffffffffffffff50,
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (in_RSI,CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (float *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
    local_48 = 0.0;
    for (local_4c = 0; local_4c < local_20 + 1; local_4c = local_4c + 1) {
      local_50 = (float)local_4c / (float)local_20;
      local_54 = Lerp(((float)local_3c + local_50) / (float)local_1c,local_24,local_28);
      __x = (int)in_RSI;
      fVar2 = std::function<float_(float)>::operator()
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      std::abs(__x);
      local_70 = (double)fVar2;
      local_68 = fVar2;
      pdVar1 = std::max<double>(&local_48,&local_70);
      local_48 = *pdVar1;
    }
    in_stack_ffffffffffffff4c = (float)local_48;
    in_stack_ffffffffffffff50 =
         (function<float_(float)> *)
         pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                   (in_RDI,(long)local_3c);
    *(float *)in_stack_ffffffffffffff50 = in_stack_ffffffffffffff4c;
  }
  return in_RDI;
}

Assistant:

pstd::vector<Float> Sample1DFunction(std::function<Float(Float)> f, int nSteps,
                                     int nSamples, Float min, Float max,
                                     Allocator alloc) {
    pstd::vector<Float> values(nSteps, Float(0), alloc);
    for (int i = 0; i < nSteps; ++i) {
        double accum = 0;
        // One extra so that we sample at the very start and the very end.
        for (int j = 0; j < nSamples + 1; ++j) {
            Float delta = Float(j) / nSamples;
            Float v = Lerp((i + delta) / Float(nSteps), min, max);
            Float fv = std::abs(f(v));
            accum = std::max<double>(accum, fv);
        }
        // There's actually no need for the divide by nSamples, since
        // these are normalzed into a PDF anyway.
        values[i] = accum;
    }
    return values;
}